

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O3

void Jinx::Impl::DebugWriteInternal(LogLevel level,Variant *var)

{
  _Rb_tree_node_base *p_Var1;
  CollectionPtr coll;
  String local_38;
  
  if (var->m_type == Collection) {
    Variant::GetCollection((Variant *)&local_38);
    for (p_Var1 = *(_Rb_tree_node_base **)(local_38._M_dataplus._M_p + 0x18);
        p_Var1 != (_Rb_tree_node_base *)(local_38._M_dataplus._M_p + 8);
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      DebugWriteInternal(level,(Variant *)&p_Var1[2]._M_parent);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_string_length);
    }
  }
  else {
    Variant::GetString_abi_cxx11_(&local_38,var);
    if (local_38._M_dataplus._M_p == (char *)0x0) {
      local_38._M_dataplus._M_p = (char *)0x0;
    }
    else {
      LogWrite(level,local_38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
    }
    MemFree(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline_t void DebugWriteInternal(LogLevel level, const Variant & var)
	{
		if (var.IsCollection())
		{
			auto coll = var.GetCollection();
			for (const auto & v : *coll)
			{
				DebugWriteInternal(level, v.second);
			}
		}
		else
		{
			auto str = var.GetString();
			auto cstr = str.c_str();
			if (cstr)
				LogWrite(level, cstr);
		}
	}